

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

int xmlCurrentChar(xmlParserCtxtPtr ctxt,int *len)

{
  byte bVar1;
  int iVar2;
  xmlChar local_c8 [8];
  char buffer [150];
  uint val;
  uchar c;
  uchar *cur;
  int *len_local;
  xmlParserCtxtPtr ctxt_local;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if (((ctxt == (xmlParserCtxtPtr)0x0) || (len == (int *)0x0)) ||
     (ctxt->input == (xmlParserInputPtr)0x0)) {
    return 0;
  }
  if (ctxt->instate == XML_PARSER_EOF) {
    return 0;
  }
  if ((0x1f < *ctxt->input->cur) && (*ctxt->input->cur < 0x80)) {
    *len = 1;
    return (uint)*ctxt->input->cur;
  }
  if (ctxt->charset != 1) {
    *len = 1;
    if (*ctxt->input->cur != '\r') {
      return (uint)*ctxt->input->cur;
    }
    if (ctxt->input->cur[1] == '\n') {
      ctxt->input->cur = ctxt->input->cur + 1;
    }
    return 10;
  }
  _val = ctxt->input->cur;
  bVar1 = *_val;
  if ((bVar1 & 0x80) == 0) {
    *len = 1;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    if ((*ctxt->input->cur == '\0') && (ctxt->input->cur < ctxt->input->end)) {
      xmlErrEncodingInt(ctxt,XML_ERR_INVALID_CHAR,"Char 0x0 out of allowed range\n",0);
    }
    if (*ctxt->input->cur != '\r') {
      return (uint)*ctxt->input->cur;
    }
    if (ctxt->input->cur[1] == '\n') {
      ctxt->input->cur = ctxt->input->cur + 1;
    }
    return 10;
  }
  if (((bVar1 & 0x40) != 0) && (bVar1 != 0xc0)) {
    if (_val[1] == 0) {
      xmlParserInputGrow(ctxt->input,0xfa);
      _val = ctxt->input->cur;
    }
    if ((_val[1] & 0xc0) == 0x80) {
      if ((bVar1 & 0xe0) == 0xe0) {
        if (_val[2] == 0) {
          xmlParserInputGrow(ctxt->input,0xfa);
          _val = ctxt->input->cur;
        }
        if ((_val[2] & 0xc0) == 0x80) {
          if ((bVar1 & 0xf0) == 0xf0) {
            if (_val[3] == 0) {
              xmlParserInputGrow(ctxt->input,0xfa);
              _val = ctxt->input->cur;
            }
            if (((bVar1 & 0xf8) == 0xf0) && ((_val[3] & 0xc0) == 0x80)) {
              *len = 4;
              buffer._144_4_ =
                   _val[3] & 0x3f |
                   (_val[2] & 0x3f) << 6 | (_val[1] & 0x3f) << 0xc | (*_val & 7) << 0x12;
              if (0xffff < (uint)buffer._144_4_) goto LAB_0019a611;
            }
          }
          else {
            *len = 3;
            buffer._144_4_ = _val[2] & 0x3f | (_val[1] & 0x3f) << 6 | (*_val & 0xf) << 0xc;
            if (0x7ff < (uint)buffer._144_4_) {
LAB_0019a611:
              if ((uint)buffer._144_4_ < 0x100) {
                if ((8 < (uint)buffer._144_4_) && ((uint)buffer._144_4_ < 0xb)) {
                  iVar7._0_1_ = buffer[0x90];
                  iVar7._1_1_ = buffer[0x91];
                  iVar7._2_1_ = buffer[0x92];
                  iVar7._3_1_ = buffer[0x93];
                  return iVar7;
                }
                if (buffer._144_4_ == 0xd) {
                  return 0xd;
                }
                if (0x1f < (uint)buffer._144_4_) {
                  iVar6._0_1_ = buffer[0x90];
                  iVar6._1_1_ = buffer[0x91];
                  iVar6._2_1_ = buffer[0x92];
                  iVar6._3_1_ = buffer[0x93];
                  return iVar6;
                }
              }
              else {
                if ((0xff < (uint)buffer._144_4_) && ((uint)buffer._144_4_ < 0xd800)) {
                  iVar5._0_1_ = buffer[0x90];
                  iVar5._1_1_ = buffer[0x91];
                  iVar5._2_1_ = buffer[0x92];
                  iVar5._3_1_ = buffer[0x93];
                  return iVar5;
                }
                if ((0xdfff < (uint)buffer._144_4_) && ((uint)buffer._144_4_ < 0xfffe)) {
                  iVar4._0_1_ = buffer[0x90];
                  iVar4._1_1_ = buffer[0x91];
                  iVar4._2_1_ = buffer[0x92];
                  iVar4._3_1_ = buffer[0x93];
                  return iVar4;
                }
                if ((0xffff < (uint)buffer._144_4_) && ((uint)buffer._144_4_ < 0x110000)) {
                  iVar3._0_1_ = buffer[0x90];
                  iVar3._1_1_ = buffer[0x91];
                  iVar3._2_1_ = buffer[0x92];
                  iVar3._3_1_ = buffer[0x93];
                  return iVar3;
                }
              }
              xmlErrEncodingInt(ctxt,XML_ERR_INVALID_CHAR,"Char 0x%X out of allowed range\n",
                                buffer._144_4_);
              iVar2._0_1_ = buffer[0x90];
              iVar2._1_1_ = buffer[0x91];
              iVar2._2_1_ = buffer[0x92];
              iVar2._3_1_ = buffer[0x93];
              return iVar2;
            }
          }
        }
      }
      else {
        *len = 2;
        buffer._144_4_ = _val[1] & 0x3f | (*_val & 0x1f) << 6;
        if (0x7f < (uint)buffer._144_4_) goto LAB_0019a611;
      }
    }
  }
  if ((long)ctxt->input->end - (long)ctxt->input->cur < 4) {
    *len = 0;
    ctxt_local._4_4_ = 0;
  }
  else {
    snprintf((char *)local_c8,0x95,"Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",(ulong)*ctxt->input->cur,
             (ulong)ctxt->input->cur[1],(ulong)ctxt->input->cur[2],(uint)ctxt->input->cur[3]);
    __xmlErrEncoding(ctxt,XML_ERR_INVALID_CHAR,"Input is not proper UTF-8, indicate encoding !\n%s",
                     local_c8,(xmlChar *)0x0);
    ctxt->charset = 10;
    *len = 1;
    ctxt_local._4_4_ = (uint)*ctxt->input->cur;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlCurrentChar(xmlParserCtxtPtr ctxt, int *len) {
    if ((ctxt == NULL) || (len == NULL) || (ctxt->input == NULL)) return(0);
    if (ctxt->instate == XML_PARSER_EOF)
	return(0);

    if ((*ctxt->input->cur >= 0x20) && (*ctxt->input->cur <= 0x7F)) {
	    *len = 1;
	    return((int) *ctxt->input->cur);
    }
    if (ctxt->charset == XML_CHAR_ENCODING_UTF8) {
	/*
	 * We are supposed to handle UTF8, check it's valid
	 * From rfc2044: encoding of the Unicode values on UTF-8:
	 *
	 * UCS-4 range (hex.)           UTF-8 octet sequence (binary)
	 * 0000 0000-0000 007F   0xxxxxxx
	 * 0000 0080-0000 07FF   110xxxxx 10xxxxxx
	 * 0000 0800-0000 FFFF   1110xxxx 10xxxxxx 10xxxxxx
	 *
	 * Check for the 0x110000 limit too
	 */
	const unsigned char *cur = ctxt->input->cur;
	unsigned char c;
	unsigned int val;

	c = *cur;
	if (c & 0x80) {
	    if (((c & 0x40) == 0) || (c == 0xC0))
		goto encoding_error;
	    if (cur[1] == 0) {
		xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
                cur = ctxt->input->cur;
            }
	    if ((cur[1] & 0xc0) != 0x80)
		goto encoding_error;
	    if ((c & 0xe0) == 0xe0) {
		if (cur[2] == 0) {
		    xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
                    cur = ctxt->input->cur;
                }
		if ((cur[2] & 0xc0) != 0x80)
		    goto encoding_error;
		if ((c & 0xf0) == 0xf0) {
		    if (cur[3] == 0) {
			xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
                        cur = ctxt->input->cur;
                    }
		    if (((c & 0xf8) != 0xf0) ||
			((cur[3] & 0xc0) != 0x80))
			goto encoding_error;
		    /* 4-byte code */
		    *len = 4;
		    val = (cur[0] & 0x7) << 18;
		    val |= (cur[1] & 0x3f) << 12;
		    val |= (cur[2] & 0x3f) << 6;
		    val |= cur[3] & 0x3f;
		    if (val < 0x10000)
			goto encoding_error;
		} else {
		  /* 3-byte code */
		    *len = 3;
		    val = (cur[0] & 0xf) << 12;
		    val |= (cur[1] & 0x3f) << 6;
		    val |= cur[2] & 0x3f;
		    if (val < 0x800)
			goto encoding_error;
		}
	    } else {
	      /* 2-byte code */
		*len = 2;
		val = (cur[0] & 0x1f) << 6;
		val |= cur[1] & 0x3f;
		if (val < 0x80)
		    goto encoding_error;
	    }
	    if (!IS_CHAR(val)) {
	        xmlErrEncodingInt(ctxt, XML_ERR_INVALID_CHAR,
				  "Char 0x%X out of allowed range\n", val);
	    }
	    return(val);
	} else {
	    /* 1-byte code */
	    *len = 1;
	    if (*ctxt->input->cur == 0)
		xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
	    if ((*ctxt->input->cur == 0) &&
	        (ctxt->input->end > ctxt->input->cur)) {
	        xmlErrEncodingInt(ctxt, XML_ERR_INVALID_CHAR,
				  "Char 0x0 out of allowed range\n", 0);
	    }
	    if (*ctxt->input->cur == 0xD) {
		if (ctxt->input->cur[1] == 0xA) {
		    ctxt->input->cur++;
		}
		return(0xA);
	    }
	    return((int) *ctxt->input->cur);
	}
    }
    /*
     * Assume it's a fixed length encoding (1) with
     * a compatible encoding for the ASCII set, since
     * XML constructs only use < 128 chars
     */
    *len = 1;
    if (*ctxt->input->cur == 0xD) {
	if (ctxt->input->cur[1] == 0xA) {
	    ctxt->input->cur++;
	}
	return(0xA);
    }
    return((int) *ctxt->input->cur);
encoding_error:
    /*
     * An encoding problem may arise from a truncated input buffer
     * splitting a character in the middle. In that case do not raise
     * an error but return 0 to indicate an end of stream problem
     */
    if (ctxt->input->end - ctxt->input->cur < 4) {
	*len = 0;
	return(0);
    }

    /*
     * If we detect an UTF8 error that probably mean that the
     * input encoding didn't get properly advertised in the
     * declaration header. Report the error and switch the encoding
     * to ISO-Latin-1 (if you don't like this policy, just declare the
     * encoding !)
     */
    {
        char buffer[150];

	snprintf(&buffer[0], 149, "Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",
			ctxt->input->cur[0], ctxt->input->cur[1],
			ctxt->input->cur[2], ctxt->input->cur[3]);
	__xmlErrEncoding(ctxt, XML_ERR_INVALID_CHAR,
		     "Input is not proper UTF-8, indicate encoding !\n%s",
		     BAD_CAST buffer, NULL);
    }
    ctxt->charset = XML_CHAR_ENCODING_8859_1;
    *len = 1;
    return((int) *ctxt->input->cur);
}